

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

bool Js::SerializationCloner<Js::StreamWriter>::IsSparseArray(JavascriptArray *arr)

{
  uint32 uVar1;
  BOOL BVar2;
  uint32 length;
  JavascriptArray *arr_local;
  
  uVar1 = ArrayObject::GetLength(&arr->super_ArrayObject);
  if (uVar1 < 0x11) {
    arr_local._7_1_ = false;
  }
  else {
    BVar2 = Js::JavascriptOperators::HasOwnItem((RecyclableObject *)arr,uVar1 >> 2);
    arr_local._7_1_ = true;
    if (BVar2 != 0) {
      BVar2 = Js::JavascriptOperators::HasOwnItem((RecyclableObject *)arr,uVar1 >> 1);
      arr_local._7_1_ = true;
      if (BVar2 != 0) {
        BVar2 = Js::JavascriptOperators::HasOwnItem
                          ((RecyclableObject *)arr,(uVar1 >> 1) + (uVar1 >> 2));
        arr_local._7_1_ = BVar2 == 0;
      }
    }
  }
  return arr_local._7_1_;
}

Assistant:

bool SerializationCloner<Writer>::IsSparseArray(JavascriptArray* arr)
    {
        uint32 length = arr->GetLength();
        if (length > SparseArraySegmentBase::HEAD_CHUNK_SIZE)
        {
            // Consider it a sparse array if the array size is non-trivial, and there
            // are empty slots found by some arbitrary sampling.
            return !JavascriptOperators::HasOwnItem(arr, length / 4)
                || !JavascriptOperators::HasOwnItem(arr, length / 2)
                || !JavascriptOperators::HasOwnItem(arr, length / 2 + length / 4);
        }

        return false;
    }